

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_writer
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  members_type *this_00;
  size_type sVar6;
  reference pptVar7;
  string *psVar8;
  t_type *type;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_200
  ;
  t_field **local_1f8;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  undefined1 local_120 [8];
  string tmpvar;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,
                           "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,")");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_70);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar5 = std::operator<<(poVar5,"oprot.IncrementRecursionDepth();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"try");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&name.field_2 + 8),(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)(name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_up((t_generator *)this);
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  this_00 = t_struct::get_sorted_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&tmpvar.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"tmp",&local_141);
  t_generator::tmp((string *)local_120,(t_generator *)this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_168);
  poVar5 = std::operator<<(poVar5,"var ");
  poVar5 = std::operator<<(poVar5,(string *)local_120);
  poVar5 = std::operator<<(poVar5," = new TStruct(\"");
  poVar5 = std::operator<<(poVar5,(string *)&fields);
  poVar5 = std::operator<<(poVar5,"\");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_188);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteStructBeginAsync(");
  poVar5 = std::operator<<(poVar5,(string *)local_120);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"tmp",&local_1c9);
    t_generator::tmp(&local_1a8,(t_generator *)this,&local_1c8);
    std::__cxx11::string::operator=((string *)local_120,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1f0);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)local_120);
    poVar5 = std::operator<<(poVar5," = new TField();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f0);
    local_1f8 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    tmpvar.field_2._8_8_ = local_1f8;
    while( true ) {
      local_200._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&tmpvar.field_2 + 8),&local_200);
      ptVar1 = tstruct_local;
      if (!bVar2) break;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      generate_null_check_begin(this,(ostream *)ptVar1,*pptVar7);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_220);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".Name = \"");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,"\";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_240);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".Type = ");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      type = t_field::get_type(*pptVar7);
      type_to_enum_abi_cxx11_(&local_260,this,type);
      poVar5 = std::operator<<(poVar5,(string *)&local_260);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_280);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".ID = ");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      iVar4 = t_field::get_key(*pptVar7);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_2a0);
      poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldBeginAsync(");
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      ptVar1 = tstruct_local;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      tfield = *pptVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c0,"",&local_2c1);
      generate_serialize_field(this,(ostream *)ptVar1,tfield,&local_2c0,false);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2e8);
      poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldEndAsync(");
      poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2e8);
      ptVar1 = tstruct_local;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      generate_null_check_end(this,(ostream *)ptVar1,*pptVar7);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&tmpvar.field_2 + 8));
    }
  }
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_308);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldStopAsync(");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_328);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteStructEndAsync(");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_348);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_368);
  poVar5 = std::operator<<(poVar5,"finally");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_388);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3a8);
  poVar5 = std::operator<<(poVar5,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3a8);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3c8);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c8);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3e8);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_writer(ostream& out, t_struct* tstruct)
{
    out << indent() << "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    string name = tstruct->get_name();
    const vector<t_field*>& fields = tstruct->get_sorted_members();
    vector<t_field*>::const_iterator f_iter;

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = new TStruct(\"" << name << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

    if (fields.size() > 0)
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TField();" << endl;
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            generate_null_check_begin( out, *f_iter);
            out << indent() << tmpvar << ".Name = \"" << (*f_iter)->get_name() << "\";" << endl
                << indent() << tmpvar << ".Type = " << type_to_enum((*f_iter)->get_type()) << ";" << endl
                << indent() << tmpvar << ".ID = " << (*f_iter)->get_key() << ";" << endl
                << indent() << "await oprot.WriteFieldBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

            generate_serialize_field(out, *f_iter);

            out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
            generate_null_check_end(out, *f_iter);
        }
    }

    out << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}